

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_tests.cpp
# Opt level: O2

void __thiscall
iu_PortableTest_x_iutest_x_FileStat_Test::Body(iu_PortableTest_x_iutest_x_FileStat_Test *this)

{
  int *in_R9;
  iuCodeMessage local_280;
  AssertionResult iutest_ar;
  Fixed local_228;
  StatStruct st;
  
  local_228.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_280.m_message._M_dataplus._M_p._0_4_ = fstat64(0,(stat64 *)&st);
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x1233ff,"::iutest::internal::posix::FileStat(0, &st)",
             (char *)&local_228,(int *)&local_280,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_228,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_228);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/port_tests.cpp"
               ,0x31,iutest_ar.m_message._M_dataplus._M_p);
    local_280._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_280,&local_228);
    std::__cxx11::string::~string((string *)&local_280);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_228);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(PortableTest, FileStat)
{
    ::iutest::internal::posix::StatStruct st;
    IUTEST_ASSERT_EQ(0, ::iutest::internal::posix::FileStat(0, &st));
}